

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlCheckImplied(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  char *pcVar1;
  int iVar2;
  startElementSAXFunc UNRECOVERED_JUMPTABLE;
  void *pvVar3;
  long lVar4;
  
  if ((((ctxt->options & 0x2000) == 0) && (htmlOmittedDefaultValue != 0)) &&
     (iVar2 = xmlStrEqual(newtag,"html"), iVar2 == 0)) {
    if (ctxt->nameNr < 1) {
      htmlnamePush(ctxt,"html");
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (UNRECOVERED_JUMPTABLE = ctxt->sax->startElement,
         UNRECOVERED_JUMPTABLE != (startElementSAXFunc)0x0)) {
        (*UNRECOVERED_JUMPTABLE)(ctxt->userData,"html",(xmlChar **)0x0);
      }
    }
    iVar2 = xmlStrEqual(newtag,"body");
    if ((iVar2 == 0) && (iVar2 = xmlStrEqual(newtag,"head"), iVar2 == 0)) {
      if ((ctxt->nameNr < 2) &&
         (((((iVar2 = xmlStrEqual(newtag,"script"), iVar2 != 0 ||
             (iVar2 = xmlStrEqual(newtag,"style"), iVar2 != 0)) ||
            (iVar2 = xmlStrEqual(newtag,(xmlChar *)"meta"), iVar2 != 0)) ||
           ((iVar2 = xmlStrEqual(newtag,"link"), iVar2 != 0 ||
            (iVar2 = xmlStrEqual(newtag,(xmlChar *)"title"), iVar2 != 0)))) ||
          (iVar2 = xmlStrEqual(newtag,"base"), iVar2 != 0)))) {
        if (ctxt->html < 3) {
          htmlnamePush(ctxt,"head");
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (UNRECOVERED_JUMPTABLE = ctxt->sax->startElement,
             UNRECOVERED_JUMPTABLE != (startElementSAXFunc)0x0)) {
            pvVar3 = ctxt->userData;
            pcVar1 = "thead";
LAB_0014e172:
            (*UNRECOVERED_JUMPTABLE)(pvVar3,(xmlChar *)(pcVar1 + 1),(xmlChar **)0x0);
            return;
          }
        }
      }
      else {
        iVar2 = xmlStrEqual(newtag,(xmlChar *)"noframes");
        if (((iVar2 == 0) && (iVar2 = xmlStrEqual(newtag,"frame"), iVar2 == 0)) &&
           ((iVar2 = xmlStrEqual(newtag,(xmlChar *)"frameset"), iVar2 == 0 && (ctxt->html < 10)))) {
          lVar4 = 0;
          do {
            if (ctxt->nameNr <= lVar4) {
              htmlnamePush(ctxt,"body");
              if (ctxt->sax == (_xmlSAXHandler *)0x0) {
                return;
              }
              UNRECOVERED_JUMPTABLE = ctxt->sax->startElement;
              if (UNRECOVERED_JUMPTABLE == (startElementSAXFunc)0x0) {
                return;
              }
              pvVar3 = ctxt->userData;
              pcVar1 = "tbody";
              goto LAB_0014e172;
            }
            iVar2 = xmlStrEqual(ctxt->nameTab[lVar4],"body");
            if (iVar2 != 0) {
              return;
            }
            iVar2 = xmlStrEqual(ctxt->nameTab[lVar4],"head");
            lVar4 = lVar4 + 1;
          } while (iVar2 == 0);
        }
      }
    }
  }
  return;
}

Assistant:

static void
htmlCheckImplied(htmlParserCtxtPtr ctxt, const xmlChar *newtag) {
    int i;

    if (ctxt->options & HTML_PARSE_NOIMPLIED)
        return;
    if (!htmlOmittedDefaultValue)
	return;
    if (xmlStrEqual(newtag, BAD_CAST"html"))
	return;
    if (ctxt->nameNr <= 0) {
	htmlnamePush(ctxt, BAD_CAST"html");
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
	    ctxt->sax->startElement(ctxt->userData, BAD_CAST"html", NULL);
    }
    if ((xmlStrEqual(newtag, BAD_CAST"body")) || (xmlStrEqual(newtag, BAD_CAST"head")))
        return;
    if ((ctxt->nameNr <= 1) &&
        ((xmlStrEqual(newtag, BAD_CAST"script")) ||
	 (xmlStrEqual(newtag, BAD_CAST"style")) ||
	 (xmlStrEqual(newtag, BAD_CAST"meta")) ||
	 (xmlStrEqual(newtag, BAD_CAST"link")) ||
	 (xmlStrEqual(newtag, BAD_CAST"title")) ||
	 (xmlStrEqual(newtag, BAD_CAST"base")))) {
        if (ctxt->html >= 3) {
            /* we already saw or generated an <head> before */
            return;
        }
        /*
         * dropped OBJECT ... i you put it first BODY will be
         * assumed !
         */
        htmlnamePush(ctxt, BAD_CAST"head");
        if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
            ctxt->sax->startElement(ctxt->userData, BAD_CAST"head", NULL);
    } else if ((!xmlStrEqual(newtag, BAD_CAST"noframes")) &&
	       (!xmlStrEqual(newtag, BAD_CAST"frame")) &&
	       (!xmlStrEqual(newtag, BAD_CAST"frameset"))) {
        if (ctxt->html >= 10) {
            /* we already saw or generated a <body> before */
            return;
        }
	for (i = 0;i < ctxt->nameNr;i++) {
	    if (xmlStrEqual(ctxt->nameTab[i], BAD_CAST"body")) {
		return;
	    }
	    if (xmlStrEqual(ctxt->nameTab[i], BAD_CAST"head")) {
		return;
	    }
	}

	htmlnamePush(ctxt, BAD_CAST"body");
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
	    ctxt->sax->startElement(ctxt->userData, BAD_CAST"body", NULL);
    }
}